

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransform.cpp
# Opt level: O3

QDataStream * operator>>(QDataStream *s,QTransform *t)

{
  long in_FS_OFFSET;
  double m33;
  double m32;
  double m31;
  double m23;
  double m22;
  double m21;
  double m13;
  double m12;
  double m11;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = -NAN;
  local_48 = -NAN;
  local_50 = -NAN;
  local_58 = -NAN;
  local_60 = -NAN;
  local_68 = -NAN;
  local_70 = -NAN;
  local_78 = -NAN;
  local_80 = -NAN;
  QDataStream::operator>>(s,&local_40);
  QDataStream::operator>>(s,&local_48);
  QDataStream::operator>>(s,&local_50);
  QDataStream::operator>>(s,&local_58);
  QDataStream::operator>>(s,&local_60);
  QDataStream::operator>>(s,&local_68);
  QDataStream::operator>>(s,&local_70);
  QDataStream::operator>>(s,&local_78);
  QDataStream::operator>>(s,&local_80);
  t->m_matrix[0][0] = local_40;
  t->m_matrix[0][1] = local_48;
  t->m_matrix[0][2] = local_50;
  t->m_matrix[1][0] = local_58;
  t->m_matrix[1][1] = local_60;
  t->m_matrix[1][2] = local_68;
  t->m_matrix[2][0] = local_70;
  t->m_matrix[2][1] = local_78;
  t->m_matrix[2][2] = local_80;
  *(ushort *)&t->field_0x48 = (ushort)*(undefined4 *)&t->field_0x48 & 0xfc00 | 0x200;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream & operator>>(QDataStream &s, QTransform &t)
{
     double m11, m12, m13,
         m21, m22, m23,
         m31, m32, m33;

     s >> m11;
     s >> m12;
     s >> m13;
     s >> m21;
     s >> m22;
     s >> m23;
     s >> m31;
     s >> m32;
     s >> m33;
     t.setMatrix(m11, m12, m13,
                 m21, m22, m23,
                 m31, m32, m33);
     return s;
}